

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O3

void __thiscall
QTextDocumentLayoutPrivate::layoutFlow
          (QTextDocumentLayoutPrivate *this,Iterator it,QTextLayoutStruct *layoutStruct,
          int layoutFrom,int layoutTo,QFixed width)

{
  QRectF *pQVar1;
  QList<QCheckPoint> *pQVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar6;
  undefined4 uVar7;
  _func_int **pp_Var5;
  int iVar8;
  int iVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  QTextFrame *pQVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  uint uVar17;
  int *piVar18;
  uint uVar19;
  uint uVar20;
  int iVar21;
  int iVar22;
  QFixed QVar23;
  int iVar24;
  int iVar25;
  QTextFrameLayoutData *data;
  long lVar26;
  QTextFrame *pQVar27;
  iterator iVar28;
  iterator iVar29;
  QTextLayout *pQVar30;
  QTextOption *pQVar31;
  QTextFrame *this_00;
  QTextFrameLayoutData *data_00;
  QTextFrameLayoutData *pQVar32;
  uint uVar33;
  ulong uVar34;
  ulong uVar35;
  int iVar36;
  QTextFrame *pQVar37;
  ulong uVar38;
  QTextDocumentLayoutPrivate *this_01;
  QTextBlockFormat *previousBlockFormat;
  QCheckPoint *pQVar39;
  long in_FS_OFFSET;
  bool bVar40;
  qreal qVar41;
  QByteArrayView QVar42;
  QByteArrayView QVar43;
  QTextLine QVar44;
  QSizeF QVar45;
  QPointF QVar46;
  int local_164;
  uint local_14c;
  double local_148;
  QRectF local_f8;
  undefined1 local_d8 [8];
  double dStack_d0;
  double local_c8;
  double dStack_c0;
  QRectF local_b8;
  undefined1 local_98 [8];
  qreal qStack_90;
  undefined1 local_88 [16];
  iterator local_78;
  undefined1 local_58 [4];
  QFixed QStack_54;
  uint uStack_50;
  QFixed QStack_4c;
  QFixed QStack_48;
  QFixed QStack_44;
  int iStack_40;
  undefined4 uStack_3c;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  QtPrivateLogging::lcLayout();
  if (((byte)QtPrivateLogging::lcLayout::category.field_2.bools.enabledDebug._q_value._M_base._M_i &
      1) != 0) {
    local_58 = (undefined1  [4])0x2;
    QStack_54.val = 0;
    uStack_50 = 0;
    QStack_4c.val = 0;
    QStack_48.val = 0;
    QStack_44.val = 0;
    iStack_40 = (int)QtPrivateLogging::lcLayout::category.name;
    uStack_3c = (undefined4)((ulong)QtPrivateLogging::lcLayout::category.name >> 0x20);
    QMessageLogger::debug();
    qVar41 = local_b8.xp;
    QVar42.m_data = &DAT_00000010;
    QVar42.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar42);
    QTextStream::operator<<((QTextStream *)qVar41,(QString *)&local_78);
    if ((QArrayData *)local_78.f != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).super___atomic_base<int>
          ._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78.f,2,0x10);
      }
    }
    if ((char)(((QArrayData *)((long)local_b8.xp + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_b8.xp,' ');
    }
    QTextStream::operator<<((QTextStream *)local_b8.xp,layoutFrom);
    if ((char)(((QArrayData *)((long)local_b8.xp + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_b8.xp,' ');
    }
    qVar41 = local_b8.xp;
    QVar43.m_data = (storage_type *)0x3;
    QVar43.m_size = (qsizetype)&local_78;
    QString::fromUtf8(QVar43);
    QTextStream::operator<<((QTextStream *)qVar41,(QString *)&local_78);
    if ((QArrayData *)local_78.f != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).super___atomic_base<int>.
      _M_i = (((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)&(local_78.f)->super_QTextObject)->_q_value).super___atomic_base<int>
          ._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_78.f,2,0x10);
      }
    }
    if ((char)(((QArrayData *)((long)local_b8.xp + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_b8.xp,' ');
    }
    QTextStream::operator<<((QTextStream *)local_b8.xp,layoutTo);
    if ((char)(((QArrayData *)((long)local_b8.xp + 0x30))->ref_)._q_value.super___atomic_base<int>.
              _M_i == '\x01') {
      QTextStream::operator<<((QTextStream *)local_b8.xp,' ');
    }
    QDebug::~QDebug((QDebug *)&local_b8);
  }
  pQVar13 = layoutStruct->frame;
  data = QTextFrame::layoutData(pQVar13);
  if (data == (QTextFrameLayoutData *)0x0) {
    lVar26 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
    if (lVar26 == 0) {
      data = (QTextFrameLayoutData *)operator_new(0x78);
      data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
      *(undefined1 (*) [16])(data + 1) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(data + 3) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(data + 5) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(data + 7) = (undefined1  [16])0x0;
      *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
      *(undefined1 (*) [16])(data + 0xc) = (undefined1  [16])0x0;
      data[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
    }
    else {
      data = (QTextFrameLayoutData *)operator_new(0x160);
      *(undefined1 (*) [16])(data + 1) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(data + 3) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(data + 5) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(data + 7) = (undefined1  [16])0x0;
      *(undefined4 *)&data[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
      data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
      *(undefined2 *)&data[0xb]._vptr_QTextFrameLayoutData = 0x101;
      *(undefined1 (*) [16])(data + 0xc) = (undefined1  [16])0x0;
      *(undefined1 (*) [16])(data + 0xe) = (undefined1  [16])0x0;
      data->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
      *(undefined1 (*) [16])(data + 0x2a) = (undefined1  [16])0x0;
      memset(data + 0x11,0,0xc0);
    }
    QTextFrame::setLayoutData(pQVar13,data);
  }
  pQVar13 = it.f;
  data[10]._vptr_QTextFrameLayoutData = (_func_int **)layoutStruct;
  local_78._28_4_ = 0xaaaaaaaa;
  local_78.f = (QTextFrame *)0x0;
  local_78.b = 0;
  local_78.e = 0;
  local_78.cf._0_4_ = 0;
  local_78.cf._4_4_ = 0;
  local_78.cb = 0;
  pQVar27 = QTextDocument::rootFrame((this->super_QAbstractTextDocumentLayoutPrivate).document);
  if (pQVar13 == pQVar27) {
    if ((layoutStruct->fullLayout == false) && ((this->checkPoints).d.size != 0)) {
      pQVar2 = &this->checkPoints;
      iVar28 = QList<QCheckPoint>::begin(pQVar2);
      iVar29 = QList<QCheckPoint>::end(pQVar2);
      if (0 < (long)iVar29.i - (long)iVar28.i) {
        uVar38 = ((ulong)((long)iVar29.i - (long)iVar28.i) >> 3) * -0x5555555555555555;
        do {
          uVar34 = uVar38 >> 1;
          uVar35 = uVar34;
          if (iVar28.i[uVar34].positionInFrame < layoutFrom) {
            uVar35 = ~uVar34 + uVar38;
            iVar28.i = iVar28.i + uVar34 + 1;
          }
          uVar38 = uVar35;
        } while (0 < (long)uVar35);
      }
      iVar29 = QList<QCheckPoint>::end(pQVar2);
      if (iVar28.i != iVar29.i) {
        iVar29 = QList<QCheckPoint>::begin(pQVar2);
        pQVar39 = iVar28.i + -1;
        if (iVar28.i == iVar29.i) {
          pQVar39 = iVar28.i;
        }
        iVar24 = (pQVar39->y).val;
        (layoutStruct->y).val = iVar24;
        iVar25 = (pQVar39->frameY).val;
        (layoutStruct->frameY).val = iVar25;
        (layoutStruct->minimumWidth).val = (pQVar39->minimumWidth).val;
        (layoutStruct->maximumWidth).val = (pQVar39->maximumWidth).val;
        (layoutStruct->contentsWidth).val = (pQVar39->contentsWidth).val;
        uVar19 = (layoutStruct->pageHeight).val;
        uVar38 = (ulong)(int)uVar19;
        if (0 < (long)uVar38) {
          uVar33 = iVar25 + iVar24;
          uVar20 = -uVar33;
          if (0 < (int)uVar33) {
            uVar20 = uVar33;
          }
          iVar25 = (int)(((uVar38 >> 1) + (ulong)uVar20 * 0x40) / uVar38);
          iVar24 = -iVar25;
          if (-1 < (int)(uVar33 ^ uVar19)) {
            iVar24 = iVar25;
          }
          (layoutStruct->pageBottom).val =
               ((iVar24 >> 6) + 1) * uVar19 - (layoutStruct->pageBottomMargin).val;
        }
        frameIteratorForTextPosition((Iterator *)local_58,this,pQVar39->positionInFrame);
        it.f = (QTextFrame *)CONCAT44(QStack_54.val,local_58);
        it.cf._0_4_ = QStack_48.val;
        it.cf._4_4_ = QStack_44.val;
        it.cb = iStack_40;
        it.b = uStack_50;
        it.e = QStack_4c.val;
        iVar28 = QList<QCheckPoint>::begin(pQVar2);
        QList<QCheckPoint>::resize
                  (pQVar2,((long)pQVar39 - (long)iVar28.i >> 3) * -0x5555555555555555 + 1);
        iVar28 = QList<QCheckPoint>::begin(pQVar2);
        if (pQVar39 != iVar28.i) {
          local_78.cf._0_4_ = (int)it.cf;
          local_78.cf._4_4_ = it.cf._4_4_;
          local_78.cb = it.cb;
          local_78.f = it.f;
          local_78.b = it.b;
          local_78.e = it.e;
          QTextFrame::iterator::operator--(&local_78);
        }
        goto LAB_004e8c3b;
      }
    }
    pQVar2 = &this->checkPoints;
    QList<QCheckPoint>::clear(pQVar2);
    uVar3 = layoutStruct->frameY;
    uVar6 = layoutStruct->y;
    uStack_50 = 0;
    uVar10 = layoutStruct->minimumWidth;
    uVar14 = layoutStruct->maximumWidth;
    QStack_44.val = (layoutStruct->contentsWidth).val;
    local_58 = (undefined1  [4])uVar6;
    QStack_54.val = uVar3;
    QStack_4c.val = uVar10;
    QStack_48.val = uVar14;
    QtPrivate::QPodArrayOps<QCheckPoint>::emplace<QCheckPoint_const&>
              ((QPodArrayOps<QCheckPoint> *)pQVar2,(this->checkPoints).d.size,
               (QCheckPoint *)local_58);
    QList<QCheckPoint>::end(pQVar2);
  }
LAB_004e8c3b:
  local_88._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
  local_88._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  QTextFrame::iterator::currentBlock(&local_78);
  QTextBlock::blockFormat((QTextBlock *)local_88);
  pQVar37 = (QTextFrame *)CONCAT44(it.cf._4_4_,(int)it.cf);
  bVar40 = pQVar37 == (QTextFrame *)0x0;
  if ((!bVar40) || (local_164 = 0, it.cb != it.e)) {
    pQVar1 = &layoutStruct->updateRectForFloats;
    local_164 = 0;
    do {
      if (0x1fffffbf < (layoutStruct->frameY).val + (layoutStruct->y).val) break;
      if (bVar40) {
        QTextFrame::iterator::currentBlock(&it);
        uVar19 = QTextBlock::position((QTextBlock *)local_58);
      }
      else {
        uVar19 = QTextFrame::firstPosition(pQVar37);
      }
      if (pQVar13 == pQVar27) {
        QVar23.val = (layoutStruct->y).val;
        uVar33 = QVar23.val - (this->checkPoints).d.ptr[(this->checkPoints).d.size + -1].y.val;
        uVar20 = -uVar33;
        if (0 < (int)uVar33) {
          uVar20 = uVar33;
        }
        if (0x1f400 < uVar20) {
          local_b8.xp = (qreal)((ulong)local_b8.xp & 0xffffffff00000000);
          local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
          floatMargins((QTextDocumentLayoutPrivate *)(ulong)uVar19,QVar23,layoutStruct,
                       (QFixed *)&local_b8,(QFixed *)local_d8);
          if ((local_b8.xp._0_4_ == (layoutStruct->x_left).val) &&
             (local_d8._0_4_ == (layoutStruct->x_right).val)) {
            uVar4 = layoutStruct->frameY;
            uVar7 = layoutStruct->y;
            uVar11 = layoutStruct->minimumWidth;
            uVar15 = layoutStruct->maximumWidth;
            QStack_44.val = (layoutStruct->contentsWidth).val;
            local_58 = (undefined1  [4])uVar7;
            QStack_54.val = uVar4;
            uStack_50 = uVar19;
            QStack_4c.val = uVar11;
            QStack_48.val = uVar15;
            QtPrivate::QPodArrayOps<QCheckPoint>::emplace<QCheckPoint_const&>
                      ((QPodArrayOps<QCheckPoint> *)&this->checkPoints,(this->checkPoints).d.size,
                       (QCheckPoint *)local_58);
            QList<QCheckPoint>::end(&this->checkPoints);
            if ((this->currentLazyLayoutPosition != -1) &&
               (this->currentLazyLayoutPosition + this->lazyLayoutStepSize < (int)uVar19)) break;
          }
        }
      }
      if (bVar40) {
        uStack_3c = 0xaaaaaaaa;
        local_58 = (undefined1  [4])0x0;
        QStack_54.val = 0;
        uStack_50 = 0;
        QStack_4c.val = 0;
        QStack_48.val = 0;
        QStack_44.val = 0;
        iStack_40 = 0;
        if (((CONCAT44(local_78.cf._4_4_,(int)local_78.cf) != 0) || (local_78.cb != local_78.e)) &&
           ((local_78.f != it.f ||
            ((CONCAT44(local_78.cf._4_4_,(int)local_78.cf) != CONCAT44(it.cf._4_4_,(int)it.cf) ||
             (local_78.cb != it.cb)))))) {
          QStack_48.val = (int)local_78.cf;
          QStack_44.val = local_78.cf._4_4_;
          iStack_40 = local_78.cb;
          local_58 = SUB84(local_78.f,0);
          QStack_54.val = (int)((ulong)local_78.f >> 0x20);
          uStack_50 = local_78.b;
          QStack_4c.val = local_78.e;
        }
        local_78.cf._0_4_ = (int)it.cf;
        local_78.cf._4_4_ = it.cf._4_4_;
        local_78.cb = it.cb;
        local_78.f = it.f;
        local_78.b = it.b;
        local_78.e = it.e;
        local_d8 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        dStack_d0 = (double)&DAT_aaaaaaaaaaaaaaaa;
        QTextFrame::iterator::currentBlock(&it);
        QTextFrame::iterator::operator++(&it);
        local_f8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        local_f8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QTextBlock::blockFormat((QTextBlock *)&local_f8);
        uVar20 = QTextFormat::intProperty((QTextFormat *)&local_f8,0x7000);
        if ((uVar20 & 1) == 0) {
          iVar24 = (layoutStruct->y).val;
          iVar36 = (layoutStruct->pageBottom).val;
        }
        else {
          iVar24 = (layoutStruct->y).val;
          iVar25 = (layoutStruct->pageHeight).val;
          iVar36 = (layoutStruct->pageBottom).val;
          if (iVar25 != 0x1fffffc0) {
            iVar25 = iVar25 + iVar36;
            (layoutStruct->pageBottom).val = iVar25;
            iVar36 = (iVar36 + (layoutStruct->pageBottomMargin).val +
                     (layoutStruct->pageTopMargin).val) - (layoutStruct->frameY).val;
            if (iVar24 <= iVar36) {
              iVar24 = iVar36;
            }
            (layoutStruct->y).val = iVar24;
            iVar36 = iVar25;
          }
        }
        iVar25 = (layoutStruct->maximumWidth).val;
        (layoutStruct->maximumWidth).val = 0;
        QTextFrame::iterator::currentBlock((iterator *)local_58);
        bVar40 = QTextBlock::isValid((QTextBlock *)&local_b8);
        previousBlockFormat = (QTextBlockFormat *)0x0;
        if (bVar40) {
          previousBlockFormat = (QTextBlockFormat *)local_88;
        }
        layoutBlock(this,(QTextBlock *)local_d8,uVar19,(QTextBlockFormat *)&local_f8,layoutStruct,
                    layoutFrom,layoutTo,previousBlockFormat);
        if (pQVar13 == pQVar27) {
          pQVar30 = QTextBlock::layout((QTextBlock *)local_d8);
          pQVar31 = QTextLayout::textOption(pQVar30);
          if ((undefined1  [24])((undefined1  [24])*pQVar31 & (undefined1  [24])0x1) ==
              (undefined1  [24])0x0) {
            this->contentHasAlignment = true;
          }
        }
        if (((((CONCAT44(it.cf._4_4_,(int)it.cf) == 0) && (it.cb == it.e)) ||
             (lVar26 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject), lVar26 == 0)) ||
            ((bVar40 = QTextBlock::isValid((QTextBlock *)local_d8), !bVar40 ||
             (iVar21 = QTextBlock::length((QTextBlock *)local_d8), iVar21 != 1)))) ||
           ((bVar40 = QTextFormat::hasProperty((QTextFormat *)&local_f8,0x1060), bVar40 ||
            (bVar40 = QTextFormat::hasProperty((QTextFormat *)&local_f8,0x820), bVar40)))) {
LAB_004e921d:
          pQVar37 = (QTextFrame *)CONCAT44(QStack_44.val,QStack_48.val);
          lVar26 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (((lVar26 != 0) && (bVar40 = QTextBlock::isValid((QTextBlock *)local_d8), bVar40)) &&
             (iVar21 = QTextBlock::length((QTextBlock *)local_d8), iVar21 == 1)) {
            iVar21 = QTextFrame::lastPosition(pQVar37);
            iVar22 = QTextBlock::position((QTextBlock *)local_d8);
            if (iVar21 == iVar22 + -1) {
              pQVar37 = (QTextFrame *)CONCAT44(QStack_44.val,QStack_48.val);
              pQVar32 = QTextFrame::layoutData(pQVar37);
              if (pQVar32 == (QTextFrameLayoutData *)0x0) {
                lVar26 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
                if (lVar26 == 0) {
                  pQVar32 = (QTextFrameLayoutData *)operator_new(0x78);
                  pQVar32->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
                  *(undefined1 (*) [16])(pQVar32 + 1) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 3) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 5) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 7) = (undefined1  [16])0x0;
                  *(undefined4 *)&pQVar32[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                  pQVar32[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined2 *)&pQVar32[0xb]._vptr_QTextFrameLayoutData = 0x101;
                  *(undefined1 (*) [16])(pQVar32 + 0xc) = (undefined1  [16])0x0;
                  pQVar32[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                }
                else {
                  pQVar32 = (QTextFrameLayoutData *)operator_new(0x160);
                  *(undefined1 (*) [16])(pQVar32 + 1) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 3) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 5) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 7) = (undefined1  [16])0x0;
                  *(undefined4 *)&pQVar32[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                  pQVar32[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined2 *)&pQVar32[0xb]._vptr_QTextFrameLayoutData = 0x101;
                  *(undefined1 (*) [16])(pQVar32 + 0xc) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 0xe) = (undefined1  [16])0x0;
                  pQVar32->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
                  *(undefined1 (*) [16])(pQVar32 + 0x2a) = (undefined1  [16])0x0;
                  memset(pQVar32 + 0x11,0,0xc0);
                }
                QTextFrame::setLayoutData(pQVar37,pQVar32);
              }
              pQVar30 = QTextBlock::layout((QTextBlock *)local_d8);
              local_98 = (undefined1  [8])0xffffffffffffffff;
              qStack_90 = -NAN;
              iVar21 = *(int *)&pQVar32[1]._vptr_QTextFrameLayoutData;
              iVar22 = *(int *)((long)&pQVar32[1]._vptr_QTextFrameLayoutData + 4);
              iVar8 = *(int *)&pQVar32[2]._vptr_QTextFrameLayoutData;
              iVar9 = *(int *)((long)&pQVar32[2]._vptr_QTextFrameLayoutData + 4);
              QTextLayout::boundingRect(&local_b8,pQVar30);
              qStack_90 = (double)(iVar22 + iVar9) * 0.015625 - local_b8.h;
              local_98 = (undefined1  [8])((double)(iVar21 + iVar8) * 0.015625);
              QTextLayout::setPosition(pQVar30,(QPointF *)local_98);
              (layoutStruct->y).val = iVar24;
              (layoutStruct->pageBottom).val = iVar36;
            }
          }
          pQVar37 = (QTextFrame *)CONCAT44(QStack_44.val,QStack_48.val);
          lVar26 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (((lVar26 != 0) && (bVar40 = QTextBlock::isValid((QTextBlock *)local_d8), bVar40)) &&
             (iVar21 = QTextBlock::length((QTextBlock *)local_d8), 1 < iVar21)) {
            QTextBlock::text((QString *)&local_b8,(QTextBlock *)local_d8);
            if (*(short *)&(((QScriptLineArray *)local_b8.yp)->d).d == 0x2028) {
              iVar21 = QTextFrame::lastPosition(pQVar37);
              iVar22 = QTextBlock::position((QTextBlock *)local_d8);
              bVar40 = iVar21 == iVar22 + -1;
            }
            else {
              bVar40 = false;
            }
            if ((QArrayData *)local_b8.xp != (QArrayData *)0x0) {
              LOCK();
              (((QBasicAtomicInt *)local_b8.xp)->_q_value).super___atomic_base<int>._M_i =
                   (((QBasicAtomicInt *)local_b8.xp)->_q_value).super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((((QBasicAtomicInt *)local_b8.xp)->_q_value).super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate((QArrayData *)local_b8.xp,2,0x10);
              }
            }
            if (bVar40) {
              pQVar37 = (QTextFrame *)CONCAT44(QStack_44.val,QStack_48.val);
              pQVar32 = QTextFrame::layoutData(pQVar37);
              if (pQVar32 == (QTextFrameLayoutData *)0x0) {
                lVar26 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
                if (lVar26 == 0) {
                  pQVar32 = (QTextFrameLayoutData *)operator_new(0x78);
                  pQVar32->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
                  *(undefined1 (*) [16])(pQVar32 + 1) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 3) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 5) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 7) = (undefined1  [16])0x0;
                  *(undefined4 *)&pQVar32[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                  pQVar32[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined2 *)&pQVar32[0xb]._vptr_QTextFrameLayoutData = 0x101;
                  *(undefined1 (*) [16])(pQVar32 + 0xc) = (undefined1  [16])0x0;
                  pQVar32[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                }
                else {
                  pQVar32 = (QTextFrameLayoutData *)operator_new(0x160);
                  *(undefined1 (*) [16])(pQVar32 + 1) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 3) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 5) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 7) = (undefined1  [16])0x0;
                  *(undefined4 *)&pQVar32[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                  pQVar32[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined2 *)&pQVar32[0xb]._vptr_QTextFrameLayoutData = 0x101;
                  *(undefined1 (*) [16])(pQVar32 + 0xc) = (undefined1  [16])0x0;
                  *(undefined1 (*) [16])(pQVar32 + 0xe) = (undefined1  [16])0x0;
                  pQVar32->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
                  *(undefined1 (*) [16])(pQVar32 + 0x2a) = (undefined1  [16])0x0;
                  memset(pQVar32 + 0x11,0,0xc0);
                }
                QTextFrame::setLayoutData(pQVar37,pQVar32);
              }
              pQVar30 = QTextBlock::layout((QTextBlock *)local_d8);
              iVar21 = QTextLayout::lineCount(pQVar30);
              if (iVar21 < 1) {
                iVar21 = 0;
              }
              else {
                QVar44 = QTextLayout::lineAt(pQVar30,0);
                local_b8.yp = (qreal)QVar44.eng;
                local_b8.xp = (qreal)CONCAT44(local_b8.xp._4_4_,QVar44.index);
                qVar41 = QTextLine::height((QTextLine *)&local_b8);
                iVar21 = (int)(qVar41 * 64.0);
              }
              if ((layoutStruct->pageBottom).val == iVar36) {
                (layoutStruct->y).val = (layoutStruct->y).val - iVar21;
                QVar46 = QTextLayout::position(pQVar30);
                local_b8.xp = QVar46.xp;
                local_b8.yp = (double)iVar21 * -0.015625 + QVar46.yp;
                QTextLayout::setPosition(pQVar30,(QPointF *)&local_b8);
              }
              else {
                (layoutStruct->y).val = iVar24 - iVar21;
                (layoutStruct->pageBottom).val = iVar36;
                layoutBlock(this,(QTextBlock *)local_d8,uVar19,(QTextBlockFormat *)&local_f8,
                            layoutStruct,layoutFrom,layoutTo,previousBlockFormat);
              }
              iVar24 = QTextLayout::lineCount(pQVar30);
              if (0 < iVar24) {
                iVar24 = *(int *)((long)&pQVar32[2]._vptr_QTextFrameLayoutData + 4);
                pp_Var5 = pQVar32[1]._vptr_QTextFrameLayoutData;
                iVar36 = *(int *)&pQVar32[2]._vptr_QTextFrameLayoutData;
                QVar44 = QTextLayout::lineAt(pQVar30,0);
                local_b8.yp = (qreal)QVar44.eng;
                local_b8.xp = (qreal)CONCAT44(local_b8.xp._4_4_,QVar44.index);
                QVar46 = QTextLayout::position(pQVar30);
                local_98 = (undefined1  [8])((double)(iVar36 + (int)pp_Var5) * 0.015625 - QVar46.xp)
                ;
                qStack_90 = (double)((iVar24 - iVar21) + (int)((ulong)pp_Var5 >> 0x20)) * 0.015625 -
                            QVar46.yp;
                QTextLine::setPosition((QTextLine *)&local_b8,(QPointF *)local_98);
              }
            }
          }
          uVar19 = QTextFormat::intProperty((QTextFormat *)&local_f8,0x7000);
          if (((uVar19 & 0x10) != 0) &&
             (iVar24 = (layoutStruct->pageHeight).val, iVar24 != 0x1fffffc0)) {
            iVar36 = (layoutStruct->y).val;
            iVar21 = (layoutStruct->pageBottom).val;
            (layoutStruct->pageBottom).val = iVar24 + iVar21;
            iVar24 = (iVar21 + (layoutStruct->pageBottomMargin).val +
                     (layoutStruct->pageTopMargin).val) - (layoutStruct->frameY).val;
            if (iVar24 < iVar36) {
              iVar24 = iVar36;
            }
            (layoutStruct->y).val = iVar24;
          }
        }
        else {
          iVar21 = QTextFrame::firstPosition((QTextFrame *)CONCAT44(it.cf._4_4_,(int)it.cf));
          iVar22 = QTextBlock::position((QTextBlock *)local_d8);
          if (iVar21 != iVar22 + 1) goto LAB_004e921d;
          local_b8.xp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          local_b8.yp = (qreal)&DAT_aaaaaaaaaaaaaaaa;
          QTextFrame::iterator::currentBlock((iterator *)local_58);
          bVar40 = QTextBlock::isValid((QTextBlock *)&local_b8);
          local_148 = 0.0;
          if (bVar40) {
            QTextBlock::blockFormat((QTextBlock *)local_98);
            local_148 = QTextFormat::doubleProperty((QTextFormat *)local_98,0x1031);
            QTextFormat::~QTextFormat((QTextFormat *)local_98);
          }
          QTextBlock::blockFormat((QTextBlock *)local_98);
          qVar41 = QTextFormat::doubleProperty((QTextFormat *)local_98,0x1030);
          if (qVar41 <= local_148) {
            qVar41 = local_148;
          }
          (layoutStruct->y).val = iVar24 + (int)(qVar41 * 64.0);
          QTextFormat::~QTextFormat((QTextFormat *)local_98);
          (layoutStruct->pageBottom).val = iVar36;
        }
        iVar24 = (layoutStruct->maximumWidth).val;
        if (local_164 <= iVar24) {
          local_164 = iVar24;
        }
        (layoutStruct->maximumWidth).val = iVar25;
        QTextFormat::operator=((QTextFormat *)local_88,(QTextFormat *)&local_f8);
        QTextFormat::~QTextFormat((QTextFormat *)&local_f8);
      }
      else {
        pQVar32 = QTextFrame::layoutData(pQVar37);
        this_01 = (QTextDocumentLayoutPrivate *)local_98;
        if (pQVar32 == (QTextFrameLayoutData *)0x0) {
          lVar26 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (lVar26 == 0) {
            pQVar32 = (QTextFrameLayoutData *)operator_new(0x78);
            pQVar32->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
            *(undefined1 (*) [16])(pQVar32 + 1) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 3) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 5) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 7) = (undefined1  [16])0x0;
            *(undefined4 *)&pQVar32[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            pQVar32[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&pQVar32[0xb]._vptr_QTextFrameLayoutData = 0x101;
            *(undefined1 (*) [16])(pQVar32 + 0xc) = (undefined1  [16])0x0;
            pQVar32[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          }
          else {
            pQVar32 = (QTextFrameLayoutData *)operator_new(0x160);
            *(undefined1 (*) [16])(pQVar32 + 1) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 3) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 5) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 7) = (undefined1  [16])0x0;
            *(undefined4 *)&pQVar32[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            pQVar32[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&pQVar32[0xb]._vptr_QTextFrameLayoutData = 0x101;
            *(undefined1 (*) [16])(pQVar32 + 0xc) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 0xe) = (undefined1  [16])0x0;
            pQVar32->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
            *(undefined1 (*) [16])(pQVar32 + 0x2a) = (undefined1  [16])0x0;
            memset(pQVar32 + 0x11,0,0xc0);
          }
          QTextFrame::setLayoutData(pQVar37,pQVar32);
        }
        local_98 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
        qStack_90 = (qreal)&DAT_aaaaaaaaaaaaaaaa;
        QTextFrame::frameFormat((QTextFrame *)this_01);
        iVar24 = QTextFormat::intProperty((QTextFormat *)this_01,0x800);
        if (iVar24 == 0) {
          uVar19 = QTextFormat::intProperty((QTextFormat *)this_01,0x7000);
          if ((uVar19 & 1) == 0) {
            QVar23.val = (layoutStruct->y).val;
          }
          else {
            QVar23.val = (layoutStruct->y).val;
            iVar24 = (layoutStruct->pageHeight).val;
            if (iVar24 != 0x1fffffc0) {
              iVar25 = (layoutStruct->pageBottom).val;
              (layoutStruct->pageBottom).val = iVar24 + iVar25;
              iVar24 = (iVar25 + (layoutStruct->pageBottomMargin).val +
                       (layoutStruct->pageTopMargin).val) - (layoutStruct->frameY).val;
              if (QVar23.val <= iVar24) {
                QVar23.val = iVar24;
              }
              (layoutStruct->y).val = QVar23.val;
            }
          }
          local_b8.xp = (qreal)((ulong)local_b8.xp & 0xffffffff00000000);
          local_d8 = (undefined1  [8])((ulong)local_d8 & 0xffffffff00000000);
          floatMargins(this_01,QVar23,layoutStruct,(QFixed *)&local_b8,(QFixed *)local_d8);
          uVar19 = (layoutStruct->x_left).val;
          if ((int)uVar19 < (int)local_b8.xp._0_4_) {
            uVar19 = local_b8.xp._0_4_;
          }
          local_b8.xp = (qreal)CONCAT44(local_b8.xp._4_4_,uVar19);
          iVar24 = (layoutStruct->x_right).val;
          if ((int)local_d8._0_4_ < iVar24) {
            iVar24 = local_d8._0_4_;
          }
          local_d8._0_4_ = iVar24;
          if ((int)(iVar24 - uVar19) < *(int *)&pQVar32[2]._vptr_QTextFrameLayoutData) {
            QVar23 = findY(this_01,(layoutStruct->y).val,layoutStruct,
                           *(int *)&pQVar32[2]._vptr_QTextFrameLayoutData);
            (layoutStruct->y).val = QVar23.val;
            floatMargins(this_01,QVar23,layoutStruct,(QFixed *)&local_b8,(QFixed *)local_d8);
            uVar19 = local_b8.xp._0_4_;
          }
          uVar35 = (ulong)uVar19;
          uVar20 = (layoutStruct->y).val;
          uVar38 = (ulong)uVar20;
          this_00 = (QTextFrame *)QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (this_00 == (QTextFrame *)0x0) {
            local_14c = 0;
          }
          else {
            QTextTable::format((QTextTable *)local_58);
            local_14c = QTextFormat::intProperty((QTextFormat *)local_58,0x1010);
            QTextFormat::~QTextFormat((QTextFormat *)local_58);
            if ((local_14c & 1) == 0 && pQVar13 == pQVar27) {
              this->contentHasAlignment = true;
            }
          }
          pQVar32[1]._vptr_QTextFrameLayoutData = (_func_int **)CONCAT44(uVar20,uVar19);
          QVar45 = QTextDocument::pageSize
                             ((this->super_QAbstractTextDocumentLayoutPrivate).document);
          if (QVar45.ht <= 0.0) {
            if (((ulong)pQVar32[0xb]._vptr_QTextFrameLayoutData & 1) != 0) goto LAB_004e9865;
          }
          else {
            *(undefined1 *)&pQVar32[0xb]._vptr_QTextFrameLayoutData = 1;
LAB_004e9865:
            QVar23.val = (layoutStruct->frameY).val;
            if (width.val == 0) {
              layoutFrame((QRectF *)local_58,this,pQVar37,layoutFrom,layoutTo,QVar23);
            }
            else {
              layoutFrame((QRectF *)local_58,this,pQVar37,layoutFrom,layoutTo,width,
                          (QFixed)0xffffffc0,QVar23);
            }
            if (this_00 == (QTextFrame *)0x0) {
              QTextFrame::begin((iterator *)local_58,pQVar37);
              QVar23 = flowPosition((iterator *)local_58);
            }
            else {
              data_00 = QTextFrame::layoutData(this_00);
              if (data_00 == (QTextFrameLayoutData *)0x0) {
                lVar26 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
                if (lVar26 == 0) {
                  data_00 = (QTextFrameLayoutData *)operator_new(0x78);
                  data_00->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
                  data_00[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined4 *)&data_00[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                  data_00[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined2 *)&data_00[0xb]._vptr_QTextFrameLayoutData = 0x101;
                  data_00[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                }
                else {
                  data_00 = (QTextFrameLayoutData *)operator_new(0x160);
                  data_00[1]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[2]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[3]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[4]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[5]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[6]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[7]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[8]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined4 *)&data_00[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
                  data_00[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  *(undefined2 *)&data_00[0xb]._vptr_QTextFrameLayoutData = 0x101;
                  data_00[0xc]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0xd]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0xf]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
                  data_00[0x2a]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  data_00[0x2b]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
                  memset(data_00 + 0x11,0,0xc0);
                }
                QTextFrame::setLayoutData(this_00,data_00);
              }
              QVar23.val = *(int *)data_00[0x21]._vptr_QTextFrameLayoutData;
            }
            iVar24 = (layoutStruct->frameY).val;
            iVar25 = (layoutStruct->pageBottom).val;
            if (iVar25 < (int)(QVar23.val + uVar20 + iVar24)) {
              uVar20 = (layoutStruct->y).val;
              iVar36 = (layoutStruct->pageHeight).val;
              uVar33 = uVar20;
              if (iVar36 != 0x1fffffc0) {
                (layoutStruct->pageBottom).val = iVar36 + iVar25;
                uVar33 = (iVar25 - iVar24) + (layoutStruct->pageBottomMargin).val +
                         (layoutStruct->pageTopMargin).val;
                if ((int)uVar33 < (int)uVar20) {
                  uVar33 = uVar20;
                }
                (layoutStruct->y).val = uVar33;
              }
              uVar38 = (ulong)uVar33;
              pQVar32[1]._vptr_QTextFrameLayoutData = (_func_int **)CONCAT44(uVar33,uVar19);
              *(undefined1 *)&pQVar32[0xb]._vptr_QTextFrameLayoutData = 1;
              QVar23.val = (layoutStruct->frameY).val;
              if (width.val == 0) {
                layoutFrame((QRectF *)local_58,this,pQVar37,layoutFrom,layoutTo,QVar23);
              }
              else {
                layoutFrame((QRectF *)local_58,this,pQVar37,layoutFrom,layoutTo,width,
                            (QFixed)0xffffffc0,QVar23);
              }
            }
          }
          iVar24 = *(int *)&pQVar32[2]._vptr_QTextFrameLayoutData;
          if (iVar24 < (int)(local_d8._0_4_ - uVar19)) {
            if ((local_14c & 2) == 0) {
              if ((local_14c & 4) != 0) {
                uVar35 = (ulong)(uVar19 + ((layoutStruct->x_right).val - iVar24) / 2);
              }
            }
            else {
              uVar35 = (ulong)((uVar19 - iVar24) + (layoutStruct->x_right).val);
            }
          }
          pQVar32[1]._vptr_QTextFrameLayoutData = (_func_int **)(uVar35 | uVar38 << 0x20);
          uVar19 = (layoutStruct->pageHeight).val;
          iVar24 = (layoutStruct->y).val +
                   *(int *)((long)&pQVar32[2]._vptr_QTextFrameLayoutData + 4);
          (layoutStruct->y).val = iVar24;
          if (uVar19 == 0) {
            iVar24 = 1;
          }
          else {
            uVar33 = iVar24 + (layoutStruct->frameY).val;
            uVar20 = -uVar33;
            if (0 < (int)uVar33) {
              uVar20 = uVar33;
            }
            uVar17 = -uVar19;
            if (0 < (int)uVar19) {
              uVar17 = uVar19;
            }
            iVar25 = (int)(((ulong)(uVar17 >> 1) + (ulong)uVar20 * 0x40) / (ulong)uVar17);
            iVar24 = -iVar25;
            if (-1 < (int)(uVar33 ^ uVar19)) {
              iVar24 = iVar25;
            }
            iVar24 = (iVar24 >> 6) + 1;
          }
          (layoutStruct->pageBottom).val = iVar24 * uVar19 - (layoutStruct->pageBottomMargin).val;
          *(undefined1 *)((long)&pQVar32[0xb]._vptr_QTextFrameLayoutData + 1) = 0;
          QTextFrame::frameFormat((QTextFrame *)local_58);
          uVar19 = QTextFormat::intProperty((QTextFormat *)local_58,0x7000);
          QTextFormat::~QTextFormat((QTextFormat *)local_58);
          if (((uVar19 & 0x10) != 0) &&
             (iVar24 = (layoutStruct->pageHeight).val, iVar24 != 0x1fffffc0)) {
            iVar25 = (layoutStruct->y).val;
            iVar36 = (layoutStruct->pageBottom).val;
            (layoutStruct->pageBottom).val = iVar24 + iVar36;
            iVar24 = (iVar36 + (layoutStruct->pageBottomMargin).val +
                     (layoutStruct->pageTopMargin).val) - (layoutStruct->frameY).val;
            if (iVar24 < iVar25) {
              iVar24 = iVar25;
            }
            (layoutStruct->y).val = iVar24;
          }
        }
        else {
          local_b8.xp = (double)(int)pQVar32[1]._vptr_QTextFrameLayoutData * 0.015625;
          local_b8.yp = (double)(int)((ulong)pQVar32[1]._vptr_QTextFrameLayoutData >> 0x20) *
                        0.015625;
          local_b8.w = (double)(int)pQVar32[2]._vptr_QTextFrameLayoutData * 0.015625;
          local_b8.h = (double)(int)((ulong)pQVar32[2]._vptr_QTextFrameLayoutData >> 0x20) *
                       0.015625;
          local_c8 = 0.0;
          dStack_c0 = 0.0;
          local_d8 = (undefined1  [8])0x0;
          dStack_d0 = 0.0;
          if (*(char *)&pQVar32[0xb]._vptr_QTextFrameLayoutData == '\x01') {
            layoutFrame((QRectF *)local_58,this,pQVar37,layoutFrom,layoutTo,(QFixed)0x0);
            local_d8 = (undefined1  [8])CONCAT44(QStack_54.val,local_58);
            dStack_d0 = (double)CONCAT44(QStack_4c.val,uStack_50);
            local_c8 = (double)CONCAT44(QStack_44.val,QStack_48.val);
            dStack_c0 = (double)CONCAT44(uStack_3c,iStack_40);
          }
          positionFloat(this,pQVar37,(QTextLine *)0x0);
          if (*(char *)&pQVar32[0xb]._vptr_QTextFrameLayoutData == '\x01') {
            layoutFrame((QRectF *)local_58,this,pQVar37,layoutFrom,layoutTo,(QFixed)0x0);
            local_d8 = (undefined1  [8])CONCAT44(QStack_54.val,local_58);
            dStack_d0 = (double)CONCAT44(QStack_4c.val,uStack_50);
            local_c8 = (double)CONCAT44(QStack_44.val,QStack_48.val);
            dStack_c0 = (double)CONCAT44(uStack_3c,iStack_40);
          }
          local_f8.xp = (double)(int)pQVar32[1]._vptr_QTextFrameLayoutData * 0.015625;
          local_f8.yp = (double)(int)((ulong)pQVar32[1]._vptr_QTextFrameLayoutData >> 0x20) *
                        0.015625;
          local_f8.w = (double)(int)pQVar32[2]._vptr_QTextFrameLayoutData * 0.015625;
          local_f8.h = (double)(int)((ulong)pQVar32[2]._vptr_QTextFrameLayoutData >> 0x20) *
                       0.015625;
          bVar40 = comparesEqual(&local_f8,&local_b8);
          if (((!bVar40) || (local_c8 <= 0.0)) || (dStack_c0 <= 0.0)) {
            local_c8 = local_f8.w;
            dStack_c0 = local_f8.h;
            local_d8 = (undefined1  [8])local_f8.xp;
            dStack_d0 = local_f8.yp;
          }
          else {
            local_d8 = (undefined1  [8])
                       ((double)(int)pQVar32[1]._vptr_QTextFrameLayoutData * 0.015625 +
                       (double)local_d8);
            dStack_d0 = (double)(int)((ulong)pQVar32[1]._vptr_QTextFrameLayoutData >> 0x20) *
                        0.015625 + dStack_d0;
          }
          if (((layoutStruct->updateRectForFloats).w <= 0.0) ||
             ((layoutStruct->updateRectForFloats).h <= 0.0)) {
            (layoutStruct->updateRectForFloats).w = local_c8;
            (layoutStruct->updateRectForFloats).h = dStack_c0;
            pQVar1->xp = (qreal)local_d8;
            (layoutStruct->updateRectForFloats).yp = dStack_d0;
          }
          else {
            QRectF::operator|((QRectF *)local_58,pQVar1);
            (layoutStruct->updateRectForFloats).w = (qreal)CONCAT44(QStack_44.val,QStack_48.val);
            (layoutStruct->updateRectForFloats).h = (qreal)CONCAT44(uStack_3c,iStack_40);
            pQVar1->xp = (qreal)CONCAT44(QStack_54.val,local_58);
            (layoutStruct->updateRectForFloats).yp = (qreal)CONCAT44(QStack_4c.val,uStack_50);
          }
          if ((0.0 < local_b8.w) && (0.0 < local_b8.h)) {
            if (((layoutStruct->updateRectForFloats).w <= 0.0) ||
               ((layoutStruct->updateRectForFloats).h <= 0.0)) {
              (layoutStruct->updateRectForFloats).w = local_b8.w;
              (layoutStruct->updateRectForFloats).h = local_b8.h;
              pQVar1->xp = local_b8.xp;
              (layoutStruct->updateRectForFloats).yp = local_b8.yp;
            }
            else {
              QRectF::operator|((QRectF *)local_58,pQVar1);
              (layoutStruct->updateRectForFloats).w = (qreal)CONCAT44(QStack_44.val,QStack_48.val);
              (layoutStruct->updateRectForFloats).h = (qreal)CONCAT44(uStack_3c,iStack_40);
              pQVar1->xp = (qreal)CONCAT44(QStack_54.val,local_58);
              (layoutStruct->updateRectForFloats).yp = (qreal)CONCAT44(QStack_4c.val,uStack_50);
            }
          }
        }
        iVar24 = *(int *)((long)&pQVar32[8]._vptr_QTextFrameLayoutData + 4);
        iVar25 = (layoutStruct->minimumWidth).val;
        iVar36 = (layoutStruct->maximumWidth).val;
        if (iVar24 < iVar25) {
          iVar24 = iVar25;
        }
        (layoutStruct->minimumWidth).val = iVar24;
        iVar24 = *(int *)&pQVar32[9]._vptr_QTextFrameLayoutData;
        if (iVar36 < *(int *)&pQVar32[9]._vptr_QTextFrameLayoutData) {
          iVar24 = iVar36;
        }
        (layoutStruct->maximumWidth).val = iVar24;
        local_78.cf._0_4_ = (int)it.cf;
        local_78.cf._4_4_ = it.cf._4_4_;
        local_78.cb = it.cb;
        local_78.f = it.f;
        local_78.b = it.b;
        local_78.e = it.e;
        QTextFrame::iterator::operator++(&it);
        QTextFormat::~QTextFormat((QTextFormat *)local_98);
      }
      pQVar37 = (QTextFrame *)CONCAT44(it.cf._4_4_,(int)it.cf);
      bVar40 = pQVar37 == (QTextFrame *)0x0;
    } while ((!bVar40) || (it.cb != it.e));
  }
  iVar24 = (layoutStruct->maximumWidth).val;
  iVar25 = local_164;
  if (local_164 < iVar24) {
    iVar25 = iVar24;
  }
  if (local_164 < 1) {
    local_164 = iVar25;
  }
  if (iVar24 != 0x1fffffc0) {
    local_164 = iVar25;
  }
  (layoutStruct->maximumWidth).val = local_164;
  lVar26 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
  if (lVar26 == 0) {
    QStack_48.val = -0x55555556;
    QStack_44.val = -0x55555556;
    local_58 = (undefined1  [4])0xaaaaaaaa;
    QStack_54.val = -0x55555556;
    uStack_50 = 0xaaaaaaaa;
    QStack_4c.val = -0x55555556;
    QTextFrame::childFrames((QList<QTextFrame_*> *)local_58,layoutStruct->frame);
    if (CONCAT44(QStack_44.val,QStack_48.val) != 0) {
      uVar38 = 0;
      do {
        pQVar37 = *(QTextFrame **)(CONCAT44(QStack_4c.val,uStack_50) + uVar38 * 8);
        pQVar32 = QTextFrame::layoutData(pQVar37);
        if (pQVar32 == (QTextFrameLayoutData *)0x0) {
          lVar26 = QMetaObject::cast((QObject *)&QTextTable::staticMetaObject);
          if (lVar26 == 0) {
            pQVar32 = (QTextFrameLayoutData *)operator_new(0x78);
            pQVar32->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextFrameData_007dcf10;
            *(undefined1 (*) [16])(pQVar32 + 1) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 3) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 5) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 7) = (undefined1  [16])0x0;
            *(undefined4 *)&pQVar32[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            pQVar32[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&pQVar32[0xb]._vptr_QTextFrameLayoutData = 0x101;
            *(undefined1 (*) [16])(pQVar32 + 0xc) = (undefined1  [16])0x0;
            pQVar32[0xe]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
          }
          else {
            pQVar32 = (QTextFrameLayoutData *)operator_new(0x160);
            *(undefined1 (*) [16])(pQVar32 + 1) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 3) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 5) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 7) = (undefined1  [16])0x0;
            *(undefined4 *)&pQVar32[9]._vptr_QTextFrameLayoutData = 0x1fffffc0;
            pQVar32[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
            *(undefined2 *)&pQVar32[0xb]._vptr_QTextFrameLayoutData = 0x101;
            *(undefined1 (*) [16])(pQVar32 + 0xc) = (undefined1  [16])0x0;
            *(undefined1 (*) [16])(pQVar32 + 0xe) = (undefined1  [16])0x0;
            pQVar32->_vptr_QTextFrameLayoutData = (_func_int **)&PTR__QTextTableData_007dd0c0;
            *(undefined1 (*) [16])(pQVar32 + 0x2a) = (undefined1  [16])0x0;
            memset(pQVar32 + 0x11,0,0xc0);
          }
          QTextFrame::setLayoutData(pQVar37,pQVar32);
        }
        if (*(char *)((long)&pQVar32[0xb]._vptr_QTextFrameLayoutData + 1) == '\0') {
          QTextFrame::frameFormat((QTextFrame *)&local_b8);
          iVar24 = QTextFormat::intProperty((QTextFormat *)&local_b8,0x800);
          QTextFormat::~QTextFormat((QTextFormat *)&local_b8);
          if (iVar24 != 0) {
            iVar25 = *(int *)((long)&pQVar32[1]._vptr_QTextFrameLayoutData + 4) +
                     *(int *)((long)&pQVar32[2]._vptr_QTextFrameLayoutData + 4);
            iVar24 = (layoutStruct->y).val;
            if (iVar25 < iVar24) {
              iVar25 = iVar24;
            }
            (layoutStruct->y).val = iVar25;
          }
        }
        uVar38 = uVar38 + 1;
      } while (uVar38 < CONCAT44(QStack_44.val,QStack_48.val));
    }
    piVar18 = (int *)CONCAT44(QStack_54.val,local_58);
    if (piVar18 != (int *)0x0) {
      LOCK();
      *piVar18 = *piVar18 + -1;
      UNLOCK();
      if (*piVar18 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(QStack_54.val,local_58),8,0x10);
      }
    }
  }
  if (pQVar13 == pQVar27) {
    if (data[0xe]._vptr_QTextFrameLayoutData != (_func_int **)0x0) {
      this->contentHasAlignment = true;
    }
    if (((CONCAT44(it.cf._4_4_,(int)it.cf) == 0) && (it.cb == it.e)) ||
       (0x1fffffbf < (layoutStruct->frameY).val + (layoutStruct->y).val)) {
      this->currentLazyLayoutPosition = -1;
      QStack_54.val = 0;
      local_58 = (undefined1  [4])(layoutStruct->y).val;
      uStack_50 = QFragmentMapData<QTextFragmentData>::length
                            (&(((this->super_QAbstractTextDocumentLayoutPrivate).docPrivate)->
                              fragments).data,0);
      uVar12 = layoutStruct->minimumWidth;
      uVar16 = layoutStruct->maximumWidth;
      QStack_44.val = (layoutStruct->contentsWidth).val;
      pQVar2 = &this->checkPoints;
      QStack_4c.val = uVar12;
      QStack_48.val = uVar16;
      QtPrivate::QPodArrayOps<QCheckPoint>::emplace<QCheckPoint_const&>
                ((QPodArrayOps<QCheckPoint> *)pQVar2,(this->checkPoints).d.size,
                 (QCheckPoint *)local_58);
      QList<QCheckPoint>::end(pQVar2);
      QList<QCheckPoint>::reserve(pQVar2,(this->checkPoints).d.size);
    }
    else {
      this->currentLazyLayoutPosition =
           (this->checkPoints).d.ptr[(this->checkPoints).d.size + -1].positionInFrame;
    }
  }
  data[10]._vptr_QTextFrameLayoutData = (_func_int **)0x0;
  QTextFormat::~QTextFormat((QTextFormat *)local_88);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QTextDocumentLayoutPrivate::layoutFlow(QTextFrame::Iterator it, QTextLayoutStruct *layoutStruct,
                                            int layoutFrom, int layoutTo, QFixed width)
{
    qCDebug(lcLayout) << "layoutFlow from=" << layoutFrom << "to=" << layoutTo;
    QTextFrameData *fd = data(layoutStruct->frame);

    fd->currentLayoutStruct = layoutStruct;

    QTextFrame::Iterator previousIt;

    const bool inRootFrame = (it.parentFrame() == document->rootFrame());
    if (inRootFrame) {
        bool redoCheckPoints = layoutStruct->fullLayout || checkPoints.isEmpty();

        if (!redoCheckPoints) {
            auto checkPoint = std::lower_bound(checkPoints.begin(), checkPoints.end(), layoutFrom);
            if (checkPoint != checkPoints.end()) {
                if (checkPoint != checkPoints.begin())
                    --checkPoint;

                layoutStruct->y = checkPoint->y;
                layoutStruct->frameY = checkPoint->frameY;
                layoutStruct->minimumWidth = checkPoint->minimumWidth;
                layoutStruct->maximumWidth = checkPoint->maximumWidth;
                layoutStruct->contentsWidth = checkPoint->contentsWidth;

                if (layoutStruct->pageHeight > 0) {
                    int page = layoutStruct->currentPage();
                    layoutStruct->pageBottom = (page + 1) * layoutStruct->pageHeight - layoutStruct->pageBottomMargin;
                }

                it = frameIteratorForTextPosition(checkPoint->positionInFrame);
                checkPoints.resize(checkPoint - checkPoints.begin() + 1);

                if (checkPoint != checkPoints.begin()) {
                    previousIt = it;
                    --previousIt;
                }
            } else {
                redoCheckPoints = true;
            }
        }

        if (redoCheckPoints) {
            checkPoints.clear();
            QCheckPoint cp;
            cp.y = layoutStruct->y;
            cp.frameY = layoutStruct->frameY;
            cp.positionInFrame = 0;
            cp.minimumWidth = layoutStruct->minimumWidth;
            cp.maximumWidth = layoutStruct->maximumWidth;
            cp.contentsWidth = layoutStruct->contentsWidth;
            checkPoints.append(cp);
        }
    }

    QTextBlockFormat previousBlockFormat = previousIt.currentBlock().blockFormat();

    QFixed maximumBlockWidth = 0;
    while (!it.atEnd() && layoutStruct->absoluteY() < QFIXED_MAX) {
        QTextFrame *c = it.currentFrame();

        int docPos;
        if (it.currentFrame())
            docPos = it.currentFrame()->firstPosition();
        else
            docPos = it.currentBlock().position();

        if (inRootFrame) {
            if (qAbs(layoutStruct->y - checkPoints.constLast().y) > 2000) {
                QFixed left, right;
                floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                if (left == layoutStruct->x_left && right == layoutStruct->x_right) {
                    QCheckPoint p;
                    p.y = layoutStruct->y;
                    p.frameY = layoutStruct->frameY;
                    p.positionInFrame = docPos;
                    p.minimumWidth = layoutStruct->minimumWidth;
                    p.maximumWidth = layoutStruct->maximumWidth;
                    p.contentsWidth = layoutStruct->contentsWidth;
                    checkPoints.append(p);

                    if (currentLazyLayoutPosition != -1
                        && docPos > currentLazyLayoutPosition + lazyLayoutStepSize)
                        break;

                }
            }
        }

        if (c) {
            // position child frame
            QTextFrameData *cd = data(c);

            QTextFrameFormat fformat = c->frameFormat();

            if (fformat.position() == QTextFrameFormat::InFlow) {
                if (fformat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
                    layoutStruct->newPage();

                QFixed left, right;
                floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                left = qMax(left, layoutStruct->x_left);
                right = qMin(right, layoutStruct->x_right);

                if (right - left < cd->size.width) {
                    layoutStruct->y = findY(layoutStruct->y, layoutStruct, cd->size.width);
                    floatMargins(layoutStruct->y, layoutStruct, &left, &right);
                }

                QFixedPoint pos(left, layoutStruct->y);

                Qt::Alignment align = Qt::AlignLeft;

                QTextTable *table = qobject_cast<QTextTable *>(c);

                if (table)
                    align = table->format().alignment() & Qt::AlignHorizontal_Mask;

                // detect whether we have any alignment in the document that disallows optimizations,
                // such as not laying out the document again in a textedit with wrapping disabled.
                if (inRootFrame && !(align & Qt::AlignLeft))
                    contentHasAlignment = true;

                cd->position = pos;

                if (document->pageSize().height() > 0.0f)
                    cd->sizeDirty = true;

                if (cd->sizeDirty) {
                    if (width != 0)
                        layoutFrame(c, layoutFrom, layoutTo, width, -1, layoutStruct->frameY);
                    else
                        layoutFrame(c, layoutFrom, layoutTo, layoutStruct->frameY);

                    QFixed absoluteChildPos = table ? pos.y + static_cast<QTextTableData *>(data(table))->rowPositions.at(0) : pos.y + firstChildPos(c);
                    absoluteChildPos += layoutStruct->frameY;

                    // drop entire frame to next page if first child of frame is on next page
                    if (absoluteChildPos > layoutStruct->pageBottom) {
                        layoutStruct->newPage();
                        pos.y = layoutStruct->y;

                        cd->position = pos;
                        cd->sizeDirty = true;

                        if (width != 0)
                            layoutFrame(c, layoutFrom, layoutTo, width, -1, layoutStruct->frameY);
                        else
                            layoutFrame(c, layoutFrom, layoutTo, layoutStruct->frameY);
                    }
                }

                // align only if there is space for alignment
                if (right - left > cd->size.width) {
                    if (align & Qt::AlignRight)
                        pos.x += layoutStruct->x_right - cd->size.width;
                    else if (align & Qt::AlignHCenter)
                        pos.x += (layoutStruct->x_right - cd->size.width) / 2;
                }

                cd->position = pos;

                layoutStruct->y += cd->size.height;
                const int page = layoutStruct->currentPage();
                layoutStruct->pageBottom = (page + 1) * layoutStruct->pageHeight - layoutStruct->pageBottomMargin;

                cd->layoutDirty = false;

                if (c->frameFormat().pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
                    layoutStruct->newPage();
            } else {
                QRectF oldFrameRect(cd->position.toPointF(), cd->size.toSizeF());
                QRectF updateRect;

                if (cd->sizeDirty)
                    updateRect = layoutFrame(c, layoutFrom, layoutTo);

                positionFloat(c);

                // If the size was made dirty when the position was set, layout again
                if (cd->sizeDirty)
                    updateRect = layoutFrame(c, layoutFrom, layoutTo);

                QRectF frameRect(cd->position.toPointF(), cd->size.toSizeF());

                if (frameRect == oldFrameRect && updateRect.isValid())
                    updateRect.translate(cd->position.toPointF());
                else
                    updateRect = frameRect;

                layoutStruct->addUpdateRectForFloat(updateRect);
                if (oldFrameRect.isValid())
                    layoutStruct->addUpdateRectForFloat(oldFrameRect);
            }

            layoutStruct->minimumWidth = qMax(layoutStruct->minimumWidth, cd->minimumWidth);
            layoutStruct->maximumWidth = qMin(layoutStruct->maximumWidth, cd->maximumWidth);

            previousIt = it;
            ++it;
        } else {
            QTextFrame::Iterator lastIt;
            if (!previousIt.atEnd() && previousIt != it)
                lastIt = previousIt;
            previousIt = it;
            QTextBlock block = it.currentBlock();
            ++it;

            const QTextBlockFormat blockFormat = block.blockFormat();

            if (blockFormat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysBefore)
                layoutStruct->newPage();

            const QFixed origY = layoutStruct->y;
            const QFixed origPageBottom = layoutStruct->pageBottom;
            const QFixed origMaximumWidth = layoutStruct->maximumWidth;
            layoutStruct->maximumWidth = 0;

            const QTextBlockFormat *previousBlockFormatPtr = nullptr;
            if (lastIt.currentBlock().isValid())
                previousBlockFormatPtr = &previousBlockFormat;

            // layout and position child block
            layoutBlock(block, docPos, blockFormat, layoutStruct, layoutFrom, layoutTo, previousBlockFormatPtr);

            // detect whether we have any alignment in the document that disallows optimizations,
            // such as not laying out the document again in a textedit with wrapping disabled.
            if (inRootFrame && !(block.layout()->textOption().alignment() & Qt::AlignLeft))
                contentHasAlignment = true;

            // if the block right before a table is empty 'hide' it by
            // positioning it into the table border
            if (isEmptyBlockBeforeTable(block, blockFormat, it)) {
                const QTextBlock lastBlock = lastIt.currentBlock();
                const qreal lastBlockBottomMargin = lastBlock.isValid() ? lastBlock.blockFormat().bottomMargin() : 0.0f;
                layoutStruct->y = origY + QFixed::fromReal(qMax(lastBlockBottomMargin, block.blockFormat().topMargin()));
                layoutStruct->pageBottom = origPageBottom;
            } else {
                // if the block right after a table is empty then 'hide' it, too
                if (isEmptyBlockAfterTable(block, lastIt.currentFrame())) {
                    QTextTableData *td = static_cast<QTextTableData *>(data(lastIt.currentFrame()));
                    QTextLayout *layout = block.layout();

                    QPointF pos((td->position.x + td->size.width).toReal(),
                                (td->position.y + td->size.height).toReal() - layout->boundingRect().height());

                    layout->setPosition(pos);
                    layoutStruct->y = origY;
                    layoutStruct->pageBottom = origPageBottom;
                }

                // if the block right after a table starts with a line separator, shift it up by one line
                if (isLineSeparatorBlockAfterTable(block, lastIt.currentFrame())) {
                    QTextTableData *td = static_cast<QTextTableData *>(data(lastIt.currentFrame()));
                    QTextLayout *layout = block.layout();

                    QFixed height = layout->lineCount() > 0 ? QFixed::fromReal(layout->lineAt(0).height()) : QFixed();

                    if (layoutStruct->pageBottom == origPageBottom) {
                        layoutStruct->y -= height;
                        layout->setPosition(layout->position() - QPointF(0, height.toReal()));
                    } else {
                        // relayout block to correctly handle page breaks
                        layoutStruct->y = origY - height;
                        layoutStruct->pageBottom = origPageBottom;
                        layoutBlock(block, docPos, blockFormat, layoutStruct, layoutFrom, layoutTo, previousBlockFormatPtr);
                    }

                    if (layout->lineCount() > 0) {
                        QPointF linePos((td->position.x + td->size.width).toReal(),
                                        (td->position.y + td->size.height - height).toReal());

                        layout->lineAt(0).setPosition(linePos - layout->position());
                    }
                }

                if (blockFormat.pageBreakPolicy() & QTextFormat::PageBreak_AlwaysAfter)
                    layoutStruct->newPage();
            }

            maximumBlockWidth = qMax(maximumBlockWidth, layoutStruct->maximumWidth);
            layoutStruct->maximumWidth = origMaximumWidth;
            previousBlockFormat = blockFormat;
        }
    }
    if (layoutStruct->maximumWidth == QFIXED_MAX && maximumBlockWidth > 0)
        layoutStruct->maximumWidth = maximumBlockWidth;
    else
        layoutStruct->maximumWidth = qMax(layoutStruct->maximumWidth, maximumBlockWidth);

    // a float at the bottom of a frame may make it taller, hence the qMax() for layoutStruct->y.
    // we don't need to do it for tables though because floats in tables are per table
    // and not per cell and layoutCell already takes care of doing the same as we do here
    if (!qobject_cast<QTextTable *>(layoutStruct->frame)) {
        QList<QTextFrame *> children = layoutStruct->frame->childFrames();
        for (int i = 0; i < children.size(); ++i) {
            QTextFrameData *fd = data(children.at(i));
            if (!fd->layoutDirty && children.at(i)->frameFormat().position() != QTextFrameFormat::InFlow)
                layoutStruct->y = qMax(layoutStruct->y, fd->position.y + fd->size.height);
        }
    }

    if (inRootFrame) {
        // we assume that any float is aligned in a way that disallows the optimizations that rely
        // on unaligned content.
        if (!fd->floats.isEmpty())
            contentHasAlignment = true;

        if (it.atEnd() || layoutStruct->absoluteY() >= QFIXED_MAX) {
            //qDebug("layout done!");
            currentLazyLayoutPosition = -1;
            QCheckPoint cp;
            cp.y = layoutStruct->y;
            cp.positionInFrame = docPrivate->length();
            cp.minimumWidth = layoutStruct->minimumWidth;
            cp.maximumWidth = layoutStruct->maximumWidth;
            cp.contentsWidth = layoutStruct->contentsWidth;
            checkPoints.append(cp);
            checkPoints.reserve(checkPoints.size());
        } else {
            currentLazyLayoutPosition = checkPoints.constLast().positionInFrame;
            // #######
            //checkPoints.last().positionInFrame = QTextDocumentPrivate::get(q->document())->length();
        }
    }


    fd->currentLayoutStruct = nullptr;
}